

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O1

BayesianGameIdenticalPayoff *
BayesianGameIdenticalPayoff::LoadTextFormat
          (BayesianGameIdenticalPayoff *__return_storage_ptr__,string *filename)

{
  char cVar1;
  ostream *poVar2;
  istream *piVar3;
  size_t sVar4;
  size_t sVar5;
  undefined8 *puVar6;
  size_t sVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrTypes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrActions;
  double tempDouble;
  size_t tempInt;
  size_t nrAgents;
  string buffer;
  ifstream fp;
  istringstream is;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_528;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_508;
  double local_4f0;
  unsigned_long local_4e8;
  size_t local_4e0;
  long local_4d8;
  undefined1 *local_4d0;
  undefined8 local_4c8;
  undefined1 local_4c0;
  undefined7 uStack_4bf;
  Interface_ProblemToPolicyDiscrete local_4b0;
  double local_4a8;
  BayesianGameIdenticalPayoff local_4a0;
  long local_3b8 [4];
  byte abStack_398 [488];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  std::ifstream::ifstream(local_3b8,(filename->_M_dataplus)._M_p,_S_in);
  if ((abStack_398[*(long *)(local_3b8[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"BayesianGameIdenticalPayoff::LoadTextFormat: failed to ",0x37)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"open file ",10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  sVar7 = 0;
  local_4e0 = 0;
  local_508.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_508.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_508.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_528.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_528.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_528.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_4e8 = 0;
  local_4f0 = 0.0;
  BayesianGameIdenticalPayoff(__return_storage_ptr__);
  local_4d0 = &local_4c0;
  local_4c8 = 0;
  local_4c0 = 0;
  local_4b0._vptr_Interface_ProblemToPolicyDiscrete =
       (_func_int **)
       &(__return_storage_ptr__->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        _m_jTypeProbsSparse;
  local_4d8 = 0;
  do {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_3b8[0] + -0x18) + (char)(istream *)local_3b8
                           );
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_3b8,(string *)&local_4d0,cVar1);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 2) != 0) {
      sVar5 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)__return_storage_ptr__);
      if (sVar5 != sVar7) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
        *puVar6 = &PTR__E_0059bd80;
        puVar6[1] = puVar6 + 3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(puVar6 + 1),
                   "BayesianGameIdenticalPayoff::LoadTextFormat wrong number of joint types in utility function"
                   ,"");
        __cxa_throw(puVar6,&E::typeinfo,E::~E);
      }
      __return_storage_ptr__->_m_initialized = true;
      if (local_4d0 != &local_4c0) {
        operator_delete(local_4d0,CONCAT71(uStack_4bf,local_4c0) + 1);
      }
      if (local_528.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_528.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_528.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_528.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_508.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_508.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_508.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_508.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::ifstream::~ifstream(local_3b8);
      return __return_storage_ptr__;
    }
    std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_4d0,_S_in);
    switch(local_4d8) {
    case 0:
      break;
    case 1:
      std::istream::_M_extract<unsigned_long>((ulong *)local_1b0);
      break;
    case 2:
      while (piVar3 = std::istream::_M_extract<unsigned_long>((ulong *)local_1b0),
            ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
        if (local_508.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_508.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_508,
                     (iterator)
                     local_508.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_4e8);
        }
        else {
          *local_508.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = local_4e8;
          local_508.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_508.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      if ((long)local_508.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_508.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != local_4e0) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
        *puVar6 = &PTR__E_0059bd80;
        puVar6[1] = puVar6 + 3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(puVar6 + 1),
                   "BayesianGameIdenticalPayoff::LoadTextFormat wrong number of actions","");
LAB_00376e12:
        __cxa_throw(puVar6,&E::typeinfo,E::~E);
      }
      break;
    case 3:
      while (piVar3 = std::istream::_M_extract<unsigned_long>((ulong *)local_1b0),
            ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
        if (local_528.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_528.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_528,
                     (iterator)
                     local_528.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_4e8);
        }
        else {
          *local_528.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = local_4e8;
          local_528.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_528.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      if ((long)local_528.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_528.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != local_4e0) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
        *puVar6 = &PTR__E_0059bd80;
        puVar6[1] = puVar6 + 3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(puVar6 + 1),
                   "BayesianGameIdenticalPayoff::LoadTextFormat wrong number of types","");
        goto LAB_00376e12;
      }
      BayesianGameIdenticalPayoff(&local_4a0,local_4e0,&local_508,&local_528,false);
      operator=(__return_storage_ptr__,&local_4a0);
      ~BayesianGameIdenticalPayoff(&local_4a0);
      break;
    case 4:
      sVar5 = 0;
      while( true ) {
        piVar3 = std::istream::_M_extract<double>((double *)local_1b0);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
        local_4a8 = local_4f0;
        if ((__return_storage_ptr__->super_BayesianGameIdenticalPayoffInterface).
            super_BayesianGameBase._m_useSparse == true) {
          local_4a0.super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
          super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
          _vptr_Interface_ProblemToPolicyDiscrete =
               (Interface_ProblemToPolicyDiscrete)
               (Interface_ProblemToPolicyDiscrete)local_4b0._vptr_Interface_ProblemToPolicyDiscrete;
          local_4a0.super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._8_8_ = sVar5;
          boost::numeric::ublas::
          sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
          ::set((sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                 *)&local_4a0,&local_4a8);
        }
        else {
          (__return_storage_ptr__->super_BayesianGameIdenticalPayoffInterface).
          super_BayesianGameBase._m_jTypeProbs.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_start[sVar5] = local_4f0;
        }
        sVar5 = (size_t)((int)sVar5 + 1);
      }
      sVar4 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)__return_storage_ptr__);
      sVar7 = 0;
      if (sVar4 != sVar5) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
        *puVar6 = &PTR__E_0059bd80;
        puVar6[1] = puVar6 + 3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(puVar6 + 1),
                   "BayesianGameIdenticalPayoff::LoadTextFormat wrong number of joint type probabilities"
                   ,"");
        goto LAB_00376e12;
      }
      break;
    default:
      sVar5 = 0;
      while( true ) {
        piVar3 = std::istream::_M_extract<double>((double *)local_1b0);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
        (*(__return_storage_ptr__->_m_utilFunction->super_QTableInterface)._vptr_QTableInterface[1])
                  (local_4f0,__return_storage_ptr__->_m_utilFunction,sVar7,sVar5);
        sVar5 = (size_t)((int)sVar5 + 1);
      }
      sVar4 = BayesianGameBase::GetNrJointActions((BayesianGameBase *)__return_storage_ptr__);
      if (sVar4 != sVar5) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
        *puVar6 = &PTR__E_0059bd80;
        puVar6[1] = puVar6 + 3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(puVar6 + 1),
                   "BayesianGameIdenticalPayoff::LoadTextFormat wrong number of actions in utility function"
                   ,"");
        goto LAB_00376e12;
      }
      sVar7 = (size_t)((int)sVar7 + 1);
    }
    local_4d8 = local_4d8 + 1;
    std::__cxx11::istringstream::~istringstream(local_1b0);
    std::ios_base::~ios_base(local_138);
  } while( true );
}

Assistant:

BayesianGameIdenticalPayoff BayesianGameIdenticalPayoff::LoadTextFormat(const string &filename)
{
    ifstream fp(filename.c_str());
    if(!fp)
    {
        cerr << "BayesianGameIdenticalPayoff::LoadTextFormat: failed to "
             << "open file " << filename << endl;            
    }

    size_t nrAgents=0;
    vector<size_t> nrActions, nrTypes;

    size_t tempInt=0;
    double tempDouble=0;
    size_t lineNumber=0;
    BayesianGameIdenticalPayoff bg;
    Index jtI=0,jaI=0;

    string buffer;
    while(!getline(fp,buffer).eof())
    {
        istringstream is(buffer);
        switch(lineNumber)
        {
        case 0:
            // skip first line (header)
            break;
        case 1:
            is >> nrAgents;
            break;
        case 2:
            while(is >> tempInt)
                nrActions.push_back(tempInt);
            if(nrActions.size()!=nrAgents)
                throw(E("BayesianGameIdenticalPayoff::LoadTextFormat wrong number of actions"));
            break;
        case 3:
            while(is >> tempInt)
                nrTypes.push_back(tempInt);
            if(nrTypes.size()!=nrAgents)
                throw(E("BayesianGameIdenticalPayoff::LoadTextFormat wrong number of types"));

            // now we have all the info to instantiate the BG
            bg=BayesianGameIdenticalPayoff(nrAgents,nrActions,nrTypes);
            break;
        case 4:
            jtI=0;
            while(is >> tempDouble)
            {
                bg.SetProbability(jtI,tempDouble);
                jtI++;
            }
            if(jtI!=bg.GetNrJointTypes())
                throw(E("BayesianGameIdenticalPayoff::LoadTextFormat wrong number of joint type probabilities"));
            jtI=0;
            break;
        default:
            jaI=0;
            while(is >> tempDouble)
            {
                bg.SetUtility(jtI,jaI,tempDouble);
                jaI++;
            }
            if(jaI!=bg.GetNrJointActions())
                throw(E("BayesianGameIdenticalPayoff::LoadTextFormat wrong number of actions in utility function"));
            jtI++;
            break;
        }

        lineNumber++;
    }
        
    if(jtI!=bg.GetNrJointTypes())
        throw(E("BayesianGameIdenticalPayoff::LoadTextFormat wrong number of joint types in utility function"));

    bg.SetInitialized(true);

    return(bg);
}